

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::majorUpdateFactor(HEkkDual *this)

{
  int iVar1;
  HVectorBase<double> *pHVar2;
  HVectorBase<double> *pHVar3;
  HEkk *pHVar4;
  uint uVar5;
  HighsInt *iRow;
  HVector_ptr *ppHVar6;
  ulong uVar7;
  HVector_ptr pHVar8;
  HVector_ptr pHVar9;
  long lVar10;
  
  iVar1 = this->multi_nFinish;
  lVar10 = (long)iVar1;
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar10) {
    uVar7 = lVar10 * 4;
  }
  iRow = (HighsInt *)operator_new__(uVar7);
  uVar5 = iVar1 - 1;
  if (1 < lVar10) {
    ppHVar6 = &this->multi_finish[1].col_aq;
    uVar7 = 0;
    pHVar8 = this->multi_finish[0].col_aq;
    pHVar9 = this->multi_finish[0].row_ep;
    do {
      pHVar2 = ppHVar6[-1];
      pHVar9->next = pHVar2;
      pHVar3 = *ppHVar6;
      pHVar8->next = pHVar3;
      iRow[uVar7] = *(HighsInt *)(ppHVar6 + -0x17);
      uVar7 = uVar7 + 1;
      ppHVar6 = ppHVar6 + 0xf;
      pHVar8 = pHVar3;
      pHVar9 = pHVar2;
    } while (uVar5 != uVar7);
  }
  iRow[(int)uVar5] = this->multi_finish[(int)uVar5].row_out;
  if (0 < iVar1) {
    HEkk::updateFactor(this->ekk_instance_,this->multi_finish[0].col_aq,this->multi_finish[0].row_ep
                       ,iRow,&this->rebuild_reason);
  }
  pHVar4 = this->ekk_instance_;
  if ((pHVar4->build_synthetic_tick_ <= pHVar4->total_synthetic_tick_) &&
     (0x31 < (pHVar4->info_).update_count)) {
    this->rebuild_reason = 2;
  }
  operator_delete__(iRow);
  return;
}

Assistant:

void HEkkDual::majorUpdateFactor() {
  /**
   * 9. Update the factor by CFT
   */
  HighsInt* iRows = new HighsInt[multi_nFinish];
  for (HighsInt iCh = 0; iCh < multi_nFinish - 1; iCh++) {
    multi_finish[iCh].row_ep->next = multi_finish[iCh + 1].row_ep;
    multi_finish[iCh].col_aq->next = multi_finish[iCh + 1].col_aq;
    iRows[iCh] = multi_finish[iCh].row_out;
  }
  iRows[multi_nFinish - 1] = multi_finish[multi_nFinish - 1].row_out;
  if (multi_nFinish > 0)
    ekk_instance_.updateFactor(multi_finish[0].col_aq, multi_finish[0].row_ep,
                               iRows, &rebuild_reason);

  // Determine whether to reinvert based on the synthetic clock
  const double use_build_synthetic_tick =
      ekk_instance_.build_synthetic_tick_ * kMultiBuildSyntheticTickMu;
  const bool reinvert_syntheticClock =
      ekk_instance_.total_synthetic_tick_ >= use_build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kMultiSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;

  delete[] iRows;
}